

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinDeserializer<std::unique_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>,_void>
     ::deserialize<InputStream>
               (unique_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                *opt,InputStream *istream)

{
  unique_ptr<int,_std::default_delete<int>_> *__ptr;
  uint8_t discriminator;
  char local_19;
  
  std::istream::read((char *)istream->stream,(long)&local_19);
  if (local_19 == '\0') {
    __ptr = (opt->_M_t).
            super___uniq_ptr_impl<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            .super__Head_base<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_false>.
            _M_head_impl;
    (opt->_M_t).
    super___uniq_ptr_impl<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    .super__Head_base<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_false>._M_head_impl =
         (unique_ptr<int,_std::default_delete<int>_> *)0x0;
    if (__ptr != (unique_ptr<int,_std::default_delete<int>_> *)0x0) {
      std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>::operator()
                ((default_delete<std::unique_ptr<int,_std::default_delete<int>_>_> *)opt,__ptr);
    }
  }
  else {
    BuiltinDeserializer<std::unique_ptr<std::unique_ptr<int,std::default_delete<int>>,std::default_delete<std::unique_ptr<int,std::default_delete<int>>>>,void>
    ::
    make_nonempty<std::unique_ptr<std::unique_ptr<int,std::default_delete<int>>,std::default_delete<std::unique_ptr<int,std::default_delete<int>>>>>
              (opt);
    BuiltinDeserializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
    deserialize<InputStream>
              ((opt->_M_t).
               super___uniq_ptr_impl<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               .super__Head_base<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_false>.
               _M_head_impl,istream);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }